

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_query.c
# Opt level: O2

void ares_query(ares_channel_t *channel,char *name,int dnsclass,int type,ares_callback callback,
               void *arg)

{
  void *arg_00;
  
  if (channel != (ares_channel_t *)0x0) {
    arg_00 = ares_dnsrec_convert_arg(callback,arg);
    if (arg_00 == (void *)0x0) {
      (*callback)(arg,0xf,0,(uchar *)0x0,0);
      return;
    }
    ares_query_dnsrec(channel,name,dnsclass,type,ares_dnsrec_convert_cb,arg_00,(unsigned_short *)0x0
                     );
  }
  return;
}

Assistant:

void ares_query(ares_channel_t *channel, const char *name, int dnsclass,
                int type, ares_callback callback, void *arg)
{
  void *carg = NULL;

  if (channel == NULL) {
    return;
  }

  carg = ares_dnsrec_convert_arg(callback, arg);
  if (carg == NULL) {
    callback(arg, ARES_ENOMEM, 0, NULL, 0); /* LCOV_EXCL_LINE: OutOfMemory */
    return;                                 /* LCOV_EXCL_LINE: OutOfMemory */
  }

  ares_query_dnsrec(channel, name, (ares_dns_class_t)dnsclass,
                    (ares_dns_rec_type_t)type, ares_dnsrec_convert_cb, carg,
                    NULL);
}